

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O1

Message * __thiscall testing::Message::operator<<(Message *this,char **pointer)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  char *pcVar2;
  
  pcVar2 = *pointer;
  pbVar1 = internal::
           scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&this->ss_);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "(null)";
  }
  else {
    pcVar2 = *pointer;
  }
  std::operator<<((ostream *)(pbVar1 + 0x10),pcVar2);
  return this;
}

Assistant:

inline Message& operator <<(T* const& pointer) {  // NOLINT
    if (pointer == NULL) {
      *ss_ << "(null)";
    } else {
      *ss_ << pointer;
    }
    return *this;
  }